

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::
optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>,_long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
::operator()(optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>,_long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
             *this,atomic_bool *stop_task,
            best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::maximize_tag>
            *best_recorder,
            vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            *constraints,int variables,quadratic_cost_type<long_double> *original_costs,
            double cost_constant)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int *piVar9;
  quadratic_cost_type<long_double> *c;
  quadratic_cost_type<long_double> *pqVar10;
  longdouble in_ST0;
  longdouble theta_00;
  longdouble lVar11;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar12;
  double dVar13;
  double kappa_max_00;
  longdouble local_240;
  uint local_208;
  int iter;
  int remaining_1;
  int push;
  int remaining;
  long i;
  undefined1 auStack_1e8 [4];
  int best_remaining;
  longdouble kappa;
  longdouble kappa_start;
  byte local_1c1;
  undefined1 local_1c0 [7];
  bool is_a_solution;
  compute_order compute;
  solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
  slv;
  long w_limit;
  longdouble pushing_objective_amplifier;
  longdouble pushing_k_factor;
  longdouble delta;
  longdouble theta;
  longdouble alpha;
  longdouble kappa_max;
  longdouble kappa_step;
  undefined1 local_78 [8];
  quadratic_cost_type<long_double> norm_costs;
  solver_parameters *p;
  bit_array x;
  double cost_constant_local;
  quadratic_cost_type<long_double> *original_costs_local;
  int variables_local;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *constraints_local;
  best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::maximize_tag>
  *best_recorder_local;
  atomic_bool *stop_task_local;
  optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>,_long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
  *this_local;
  
  pqVar10 = original_costs;
  x.super_bit_array_impl.m_data._M_t.
  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
       (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
       cost_constant;
  bit_array::bit_array((bit_array *)&p,variables);
  norm_costs.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)this->m_ctx;
  c = (quadratic_cost_type<long_double> *)&this->m_local_ctx;
  iVar8 = variables;
  normalize_costs<long_double,baryonyx::itm::quadratic_cost_type<long_double>>
            ((quadratic_cost_type<long_double> *)local_78,(itm *)this->m_ctx,
             (context *)original_costs,c,(random_engine *)(ulong)(uint)variables,(int)pqVar10);
  dVar2 = *(double *)
           ((long)norm_costs.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                  _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl + 0x20);
  dVar3 = *(double *)
           ((long)norm_costs.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                  _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl + 0x28);
  theta_00 = (longdouble)
             *(double *)
              ((long)norm_costs.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>
                     ._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                     super__Head_base<0UL,_int_*,_false>._M_head_impl + 8);
  if (0.0 <= *(double *)
              ((long)norm_costs.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>
                     ._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                     super__Head_base<0UL,_int_*,_false>._M_head_impl + 0x10)) {
    local_240 = (longdouble)
                *(double *)
                 ((long)norm_costs.indices._M_t.
                        super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 0x10);
    lVar11 = in_ST0;
  }
  else {
    compute_delta<long_double,baryonyx::itm::quadratic_cost_type<long_double>>
              ((longdouble *)this->m_ctx,(itm *)local_78,(context *)(ulong)(uint)variables,c,
               theta_00,iVar8);
    lVar11 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    local_240 = in_ST0;
  }
  dVar4 = *(double *)
           ((long)norm_costs.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                  _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl + 0x38);
  dVar5 = *(double *)
           ((long)norm_costs.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                  _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl + 0x40);
  dVar1 = *(double *)
           ((long)norm_costs.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                  _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl + 0xa0);
  iVar8 = length<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                    (constraints);
  solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
  ::solver_random_inequalities_101coeff
            ((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
              *)&compute.order,&(this->m_local_ctx).rng,iVar8,variables,(cost_type *)local_78,
             constraints);
  compute_order::compute_order
            ((compute_order *)local_1c0,
             *(constraint_order *)
              ((long)norm_costs.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>
                     ._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                     super__Head_base<0UL,_int_*,_false>._M_head_impl + 0xcc),variables);
  local_1c1 = 0;
  do {
    bVar6 = std::atomic<bool>::load(stop_task,seq_cst);
    if (((bVar6 ^ 0xffU) & 1) == 0) {
      compute_order::~compute_order((compute_order *)local_1c0);
      solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
      ::~solver_random_inequalities_101coeff
                ((solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
                  *)&compute.order);
      quadratic_cost_type<long_double>::~quadratic_cost_type
                ((quadratic_cost_type<long_double> *)local_78);
      bit_array::~bit_array((bit_array *)&p);
      return;
    }
    this->m_call_number = this->m_call_number + 1;
    kappa_max_00 = *(double *)
                    ((long)norm_costs.indices._M_t.
                           super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                           super__Head_base<0UL,_int_*,_false>._M_head_impl + 0x28);
    dVar13 = best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::maximize_tag>
             ::reinit(best_recorder,&this->m_local_ctx,(bool)(local_1c1 & 1),
                      *(double *)
                       ((long)norm_costs.indices._M_t.
                              super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl + 0x18),kappa_max_00,
                      (bit_array *)&p);
    _auStack_1e8 = (longdouble)dVar13;
    unique0x100005f6 = _auStack_1e8;
    compute_order::
    init<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>,baryonyx::bit_array>
              ((compute_order *)local_1c0,
               (solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
                *)&compute.order,(bit_array *)&p);
    i._4_4_ = 0x7fffffff;
    local_1c1 = 0;
    _push = 0;
    while( true ) {
      bVar7 = std::atomic<bool>::load(stop_task,seq_cst);
      bVar6 = false;
      if (!bVar7) {
        bVar6 = _push != *(long *)((long)norm_costs.indices._M_t.
                                         super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                                         _M_t.
                                         super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                         super__Head_base<0UL,_int_*,_false>._M_head_impl + 0xb0);
      }
      if (!bVar6) goto LAB_00294617;
      lVar12 = in_ST4;
      remaining_1 = compute_order::
                    run<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>,baryonyx::bit_array,long_double>
                              ((compute_order *)local_1c0,
                               (solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
                                *)&compute.order,(bit_array *)&p,&(this->m_local_ctx).rng,
                               _auStack_1e8,local_240,theta_00);
      if (remaining_1 == 0) break;
      piVar9 = std::min<int>(&remaining_1,(int *)((long)&i + 4));
      i._4_4_ = *piVar9;
      if ((long)dVar1 < _push) {
        dVar13 = std::pow(dVar13,kappa_max_00);
        _auStack_1e8 = _auStack_1e8 + (longdouble)dVar2 * lVar11;
        lVar11 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = lVar12;
      }
      if ((longdouble)dVar3 < _auStack_1e8) goto LAB_00294617;
      _push = _push + 1;
    }
    dVar13 = quadratic_cost_type<long_double>::results
                       (original_costs,(bit_array *)&p,
                        (double)x.super_bit_array_impl.m_data._M_t.
                                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
    best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::maximize_tag>
    ::try_update(best_recorder,&this->m_local_ctx,(bit_array *)&p,dVar13,_push);
    i._4_4_ = 0;
    local_1c1 = 1;
LAB_00294617:
    if (i._4_4_ < 1) {
      iter = 0;
      while( true ) {
        bVar7 = std::atomic<bool>::load(stop_task,seq_cst);
        bVar6 = false;
        if (!bVar7) {
          bVar6 = iter < *(int *)((long)norm_costs.indices._M_t.
                                        super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t
                                        .super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                        super__Head_base<0UL,_int_*,_false>._M_head_impl + 0xbc);
        }
        if (!bVar6) break;
        in_ST4 = in_ST3;
        iVar8 = compute_order::
                push_and_run<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>,baryonyx::bit_array,long_double>
                          ((compute_order *)local_1c0,
                           (solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
                            *)&compute.order,(bit_array *)&p,&(this->m_local_ctx).rng,
                           (longdouble)dVar4,local_240,theta_00,(longdouble)dVar5);
        if (iVar8 == 0) {
          dVar13 = quadratic_cost_type<long_double>::results
                             (original_costs,(bit_array *)&p,
                              (double)x.super_bit_array_impl.m_data._M_t.
                                      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                      .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
          best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::maximize_tag>
          ::try_update(best_recorder,&this->m_local_ctx,(bit_array *)&p,dVar13,
                       (long)(-iter * *(int *)((long)norm_costs.indices._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<int,_std::default_delete<int[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>
                                                  .super__Head_base<0UL,_int_*,_false>._M_head_impl
                                              + 0xc0) + -1));
          local_1c1 = 1;
        }
        _auStack_1e8 = stack0xfffffffffffffe28;
        local_208 = 0;
        while( true ) {
          bVar7 = std::atomic<bool>::load(stop_task,seq_cst);
          bVar6 = false;
          if (!bVar7) {
            bVar6 = (int)local_208 <
                    *(int *)((long)norm_costs.indices._M_t.
                                   super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                   super__Head_base<0UL,_int_*,_false>._M_head_impl + 0xc0);
          }
          if (!bVar6) goto LAB_00294953;
          lVar12 = in_ST4;
          iVar8 = compute_order::
                  run<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>>,baryonyx::bit_array,long_double>
                            ((compute_order *)local_1c0,
                             (solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>_>
                              *)&compute.order,(bit_array *)&p,&(this->m_local_ctx).rng,_auStack_1e8
                             ,local_240,theta_00);
          if (iVar8 == 0) break;
          if (*(double *)
               ((long)norm_costs.indices._M_t.
                      super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                      super__Head_base<0UL,_int_*,_false>._M_head_impl + 0xa0) <
              (double)(int)local_208) {
            std::pow((double)(int)local_208,kappa_max_00);
            _auStack_1e8 = _auStack_1e8 + (longdouble)dVar2 * lVar11;
            lVar11 = in_ST1;
            in_ST1 = in_ST2;
            in_ST2 = in_ST3;
            in_ST3 = in_ST4;
            in_ST4 = lVar12;
          }
          if ((longdouble)dVar3 < _auStack_1e8) goto LAB_00294953;
          local_208 = local_208 + 1;
        }
        dVar13 = quadratic_cost_type<long_double>::results
                           (original_costs,(bit_array *)&p,
                            (double)x.super_bit_array_impl.m_data._M_t.
                                    super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                    .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
        best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::maximize_tag>
        ::try_update(best_recorder,&this->m_local_ctx,(bit_array *)&p,dVar13,
                     (long)(int)(~local_208 +
                                -iter * *(int *)((long)norm_costs.indices._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<int,_std::default_delete<int[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>
                                                  .super__Head_base<0UL,_int_*,_false>._M_head_impl
                                                + 0xc0)));
        local_1c1 = 1;
LAB_00294953:
        iter = iter + 1;
      }
    }
    else {
      best_solution_recorder<baryonyx::itm::quadratic_cost_type<long_double>,_long_double,_baryonyx::itm::maximize_tag>
      ::try_advance(best_recorder,&this->m_local_ctx,(bit_array *)&p,i._4_4_,
                    *(long *)((long)norm_costs.indices._M_t.
                                    super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                                    super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                    super__Head_base<0UL,_int_*,_false>._M_head_impl + 0xb0));
    }
  } while( true );
}

Assistant:

void operator()(const std::atomic_bool& stop_task,
                    best_solution_recorder<Cost, Float, Mode>& best_recorder,
                    const std::vector<merged_constraint>& constraints,
                    int variables,
                    const Cost& original_costs,
                    double cost_constant)
    {
        bit_array x(variables);

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_local_ctx.rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const auto w_limit = static_cast<long int>(p.w);

        Solver slv(m_local_ctx.rng,
                   length(constraints),
                   variables,
                   norm_costs,
                   constraints);

        compute_order compute(p.order, variables);
        bool is_a_solution = false;

        while (!stop_task.load()) {
            ++m_call_number;
            const auto kappa_start = static_cast<Float>(best_recorder.reinit(
              m_local_ctx, is_a_solution, p.kappa_min, p.kappa_max, x));
            auto kappa = kappa_start;
            compute.init(slv, x);

            auto best_remaining = INT_MAX;
            is_a_solution = false;

            for (long int i = 0; !stop_task.load() && i != p.limit; ++i) {
                auto remaining =
                  compute.run(slv, x, m_local_ctx.rng, kappa, delta, theta);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      i);

                    best_remaining = 0;
                    is_a_solution = true;
                    break;
                } else {
                    best_remaining = std::min(remaining, best_remaining);
                }

                if (i > w_limit)
                    kappa +=
                      kappa_step * std::pow(static_cast<Float>(remaining) /
                                              static_cast<Float>(slv.m),
                                            alpha);

                if (kappa > kappa_max)
                    break;
            }

            if (best_remaining > 0) {
                best_recorder.try_advance(
                  m_local_ctx, x, best_remaining, p.limit);
                continue;
            }

            for (int push = 0; !stop_task.load() && push < p.pushes_limit;
                 ++push) {

                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_local_ctx.rng,
                                       pushing_k_factor,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      -push * p.pushing_iteration_limit - 1);
                    is_a_solution = true;
                }

                kappa = kappa_start;
                for (int iter = 0;
                     !stop_task.load() && iter < p.pushing_iteration_limit;
                     ++iter) {

                    remaining = compute.run(
                      slv, x, m_local_ctx.rng, kappa, delta, theta);

                    if (remaining == 0) {
                        best_recorder.try_update(
                          m_local_ctx,
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        is_a_solution = true;
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;
                }
            }
        }
    }